

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_count(BYTE *pIn,BYTE *pMatch,BYTE *pInLimit)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  piVar2 = (int *)pIn;
  if (pIn < pInLimit + -7) {
    if (*(ulong *)pMatch != *(ulong *)pIn) {
      uVar4 = *(ulong *)pIn ^ *(ulong *)pMatch;
      uVar5 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      return uVar5 >> 3 & 0x1fffffff;
    }
    lVar3 = 0;
    while (pIn + lVar3 + 8 < pInLimit + -7) {
      lVar1 = lVar3 + 8;
      uVar5 = *(ulong *)(pIn + lVar3 + 8);
      lVar3 = lVar3 + 8;
      if (*(ulong *)(pMatch + lVar1) != uVar5) {
        uVar5 = uVar5 ^ *(ulong *)(pMatch + lVar1);
        uVar4 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        return (uVar4 >> 3 & 0x1fffffff) + lVar3;
      }
    }
    pMatch = pMatch + lVar3 + 8;
    piVar2 = (int *)(pIn + lVar3 + 8);
  }
  if ((piVar2 < pInLimit + -3) && (*(int *)pMatch == *piVar2)) {
    piVar2 = piVar2 + 1;
    pMatch = (BYTE *)((long)pMatch + 4);
  }
  if ((piVar2 < pInLimit + -1) && ((short)*(int *)pMatch == (short)*piVar2)) {
    piVar2 = (int *)((long)piVar2 + 2);
    pMatch = (BYTE *)((long)pMatch + 2);
  }
  if (piVar2 < pInLimit) {
    piVar2 = (int *)((long)piVar2 + (ulong)((char)*(int *)pMatch == (char)*piVar2));
  }
  return (long)piVar2 - (long)pIn;
}

Assistant:

MEM_STATIC size_t ZSTD_count(const BYTE* pIn, const BYTE* pMatch, const BYTE* const pInLimit)
{
    const BYTE* const pStart = pIn;
    const BYTE* const pInLoopLimit = pInLimit - (sizeof(size_t)-1);

    if (pIn < pInLoopLimit) {
        { size_t const diff = MEM_readST(pMatch) ^ MEM_readST(pIn);
          if (diff) return ZSTD_NbCommonBytes(diff); }
        pIn+=sizeof(size_t); pMatch+=sizeof(size_t);
        while (pIn < pInLoopLimit) {
            size_t const diff = MEM_readST(pMatch) ^ MEM_readST(pIn);
            if (!diff) { pIn+=sizeof(size_t); pMatch+=sizeof(size_t); continue; }
            pIn += ZSTD_NbCommonBytes(diff);
            return (size_t)(pIn - pStart);
    }   }
    if (MEM_64bits() && (pIn<(pInLimit-3)) && (MEM_read32(pMatch) == MEM_read32(pIn))) { pIn+=4; pMatch+=4; }
    if ((pIn<(pInLimit-1)) && (MEM_read16(pMatch) == MEM_read16(pIn))) { pIn+=2; pMatch+=2; }
    if ((pIn<pInLimit) && (*pMatch == *pIn)) pIn++;
    return (size_t)(pIn - pStart);
}